

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.cpp
# Opt level: O2

spv_result_t
spvOperandTableValueLookup
          (spv_target_env param_1,spv_operand_table table,spv_operand_type_t type,uint32_t value,
          spv_operand_desc *pEntry)

{
  spv_operand_desc_group_t *psVar1;
  ulong uVar2;
  spv_operand_desc_t *psVar3;
  ulong uVar4;
  difference_type __d;
  ulong uVar5;
  
  if (table == (spv_operand_table)0x0) {
    return SPV_ERROR_INVALID_TABLE;
  }
  if (pEntry != (spv_operand_desc *)0x0) {
    uVar2 = 0;
    do {
      if (uVar2 == table->count) {
        return SPV_ERROR_INVALID_LOOKUP;
      }
      psVar1 = table->types;
      if (psVar1[uVar2].type == type) {
        psVar3 = psVar1[uVar2].entries;
        uVar5 = (ulong)psVar1[uVar2].count;
        while (uVar4 = uVar5, 0 < (long)uVar4) {
          uVar5 = uVar4 >> 1;
          if (psVar3[uVar5].value < value) {
            psVar3 = psVar3 + uVar5 + 1;
            uVar5 = ~uVar5 + uVar4;
          }
        }
        if ((psVar3 != psVar1[uVar2].entries + psVar1[uVar2].count) && (psVar3->value == value)) {
          *pEntry = psVar3;
          return SPV_SUCCESS;
        }
      }
      uVar2 = uVar2 + 1;
    } while( true );
  }
  return SPV_ERROR_INVALID_POINTER;
}

Assistant:

spv_result_t spvOperandTableValueLookup(spv_target_env,
                                        const spv_operand_table table,
                                        const spv_operand_type_t type,
                                        const uint32_t value,
                                        spv_operand_desc* pEntry) {
  if (!table) return SPV_ERROR_INVALID_TABLE;
  if (!pEntry) return SPV_ERROR_INVALID_POINTER;

  spv_operand_desc_t needle = {"", value,   0,  nullptr, 0,  nullptr,
                               0,  nullptr, {}, ~0u,     ~0u};

  auto comp = [](const spv_operand_desc_t& lhs, const spv_operand_desc_t& rhs) {
    return lhs.value < rhs.value;
  };

  for (uint64_t typeIndex = 0; typeIndex < table->count; ++typeIndex) {
    const auto& group = table->types[typeIndex];
    if (type != group.type) continue;

    const auto beg = group.entries;
    const auto end = group.entries + group.count;

    // Assumes the underlying table is already sorted ascendingly according to
    // opcode value.
    auto it = std::lower_bound(beg, end, needle, comp);
    if (it != end && it->value == value) {
      // The current operand is considered available as long as
      // it is in the grammar.  It might not be *valid* to use,
      // but that should be checked by the validator, not by parsing.
      *pEntry = it;
      return SPV_SUCCESS;
    }
  }

  return SPV_ERROR_INVALID_LOOKUP;
}